

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

void __thiscall
amrex::AmrMesh::MakeNewGrids
          (AmrMesh *this,int lbase,Real time,int *new_finest,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *new_grids)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Box *pBVar2;
  IntVect *pIVar3;
  Real eff;
  byte bVar4;
  int iVar5;
  int iVar6;
  pointer pGVar7;
  pointer pBVar8;
  long *plVar9;
  pointer pBVar10;
  pointer pBVar11;
  undefined8 uVar12;
  pointer pBVar13;
  uint uVar14;
  bool bVar15;
  uint uVar16;
  int iVar17;
  undefined4 uVar18;
  int iVar19;
  BoxList *__x;
  undefined4 uVar20;
  pointer pIVar21;
  undefined4 uVar22;
  ulong uVar23;
  undefined8 *puVar24;
  pointer pIVar25;
  undefined8 *puVar26;
  pointer pIVar27;
  ulong uVar28;
  int n_1;
  long lVar29;
  int n;
  long lVar30;
  long lVar31;
  int iVar32;
  int dir;
  long lVar33;
  byte bVar34;
  IntVect ngt;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> bf_lev;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> pc_domain;
  BoxList new_bx;
  PinnedVector<IntVect> tagvec;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_comp_ba;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> rr_lev;
  BoxList bl;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> p_n_ba;
  Box result;
  ClusterList clist;
  BoxArray ba_proj;
  BoxList local_448;
  long local_420;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *local_418;
  long local_410;
  IntVect local_408;
  int local_3fc;
  BoxList local_3f8;
  ulong local_3d8;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_3d0;
  vector<amrex::Box,_std::allocator<amrex::Box>_> local_3b8;
  int local_39c;
  BoxList local_398;
  PinnedVector<IntVect> local_378;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_358;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_340;
  Real local_328;
  BoxList local_320;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> local_300;
  FabArray<amrex::TagBox> local_2e8;
  undefined1 local_160 [200];
  BoxArray local_98;
  
  bVar34 = 0;
  uVar16 = (this->super_AmrInfo).max_level;
  uVar23 = (ulong)uVar16;
  iVar32 = *(int *)&(this->super_AmrInfo).field_0x8c;
  iVar19 = uVar16 - 1;
  if (iVar32 <= (int)(uVar16 - 1)) {
    iVar19 = iVar32;
  }
  local_418 = new_grids;
  local_328 = time;
  if (((long)(new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 < (long)(iVar19 + 2)) {
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              (&new_grids->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
               (long)(iVar19 + 2));
    uVar16 = (this->super_AmrInfo).max_level;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            (&local_3d0,(long)(int)uVar16,(allocator_type *)&local_2e8);
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::vector
            (&local_340,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            (&local_3b8,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  if (-1 < iVar19) {
    pIVar21 = (this->super_AmrInfo).ref_ratio.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar27 = (this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar28 = 0;
    pIVar25 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      pIVar27 = pIVar27 + 1;
      lVar30 = 0;
      do {
        iVar17 = pIVar27->vect[lVar30] / pIVar21->vect[lVar30];
        if (iVar17 < 2) {
          iVar17 = 1;
        }
        pIVar25->vect[lVar30] = iVar17;
        lVar30 = lVar30 + 1;
      } while (lVar30 != 3);
      uVar28 = uVar28 + 1;
      pIVar25 = pIVar25 + 1;
      pIVar21 = pIVar21 + 1;
    } while (uVar28 != iVar19 + 1);
  }
  if (lbase < iVar19) {
    lVar30 = (long)lbase;
    pIVar27 = local_340.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar30;
    pIVar25 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar30;
    pIVar21 = (this->super_AmrInfo).ref_ratio.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar30;
    do {
      lVar29 = 0;
      do {
        pIVar27->vect[lVar29] =
             (pIVar25->vect[lVar29] * pIVar21->vect[lVar29]) / pIVar25[1].vect[lVar29];
        lVar29 = lVar29 + 1;
      } while (lVar29 != 3);
      lVar30 = lVar30 + 1;
      pIVar27 = pIVar27 + 1;
      pIVar25 = pIVar25 + 1;
      pIVar21 = pIVar21 + 1;
    } while (lVar30 != iVar19);
  }
  if (lbase <= iVar19) {
    lVar30 = (long)lbase;
    pIVar21 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start + lVar30;
    do {
      pGVar7 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar27 = local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar30;
      pBVar2 = &pGVar7[lVar30].domain;
      pBVar11 = *(pointer *)&pBVar2->smallend;
      lVar29 = *(long *)((pBVar2->smallend).vect + 2);
      pIVar3 = &pGVar7[lVar30].domain.bigend;
      lVar31 = *(long *)pIVar3->vect;
      uVar12 = *(undefined8 *)(pIVar3->vect + 2);
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
           SUB84((ulong)lVar31 >> 0x20,0);
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)uVar12
      ;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
           (int)((ulong)uVar12 >> 0x20);
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = (BATType)lVar29;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           SUB84((ulong)lVar29 >> 0x20,0);
      iVar17 = pIVar27->vect[0];
      iVar5 = pIVar27->vect[1];
      local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ = (uint)((ulong)pBVar11 >> 0x20);
      uVar16 = local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_;
      uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
      if (iVar5 == 1 && iVar17 == 1) {
        local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)pBVar11;
        if (pIVar27->vect[2] != 1) goto LAB_004b2d16;
      }
      else {
        local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ = (uint)pBVar11;
        if (iVar17 != 1) {
          if (iVar17 == 4) {
            if ((int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase < 0) {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   (int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase >> 2;
            }
            else {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase >> 2;
            }
          }
          else if (iVar17 == 2) {
            if ((int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase < 0) {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   (int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase >> 1;
            }
            else {
              local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                   (uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase >> 1;
            }
          }
          else if ((int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase < 0) {
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                 ~((int)~(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase / iVar17);
          }
          else {
            local_2e8.super_FabArrayBase._vptr_FabArrayBase._0_4_ =
                 (int)(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase / iVar17;
          }
        }
        if (iVar5 != 1) {
          if (iVar5 == 4) {
            if ((long)pBVar11 < 0) {
              uVar16 = (int)local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ >> 2;
            }
            else {
              uVar16 = local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ >> 2;
            }
          }
          else if (iVar5 == 2) {
            if ((long)pBVar11 < 0) {
              uVar16 = (int)local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ >> 1;
            }
            else {
              uVar16 = local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ >> 1;
            }
          }
          else if ((long)pBVar11 < 0) {
            uVar16 = ~((int)~local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ / iVar5);
          }
          else {
            uVar16 = (int)local_2e8.super_FabArrayBase._vptr_FabArrayBase._4_4_ / iVar5;
          }
        }
LAB_004b2d16:
        local_2e8.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)CONCAT44(uVar16,(uint)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
        iVar6 = pIVar27->vect[2];
        if (iVar6 != 1) {
          if (iVar6 == 4) {
            if ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type < 0) {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                   (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type >> 2;
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type >> 2;
            }
          }
          else if (iVar6 == 2) {
            if ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type < 0) {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                   (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type >> 1;
            }
            else {
              local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type >> 1;
            }
          }
          else if ((int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type < 0) {
            local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                 ~((int)~local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type / iVar6);
          }
          else {
            local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
                 (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type / iVar6;
          }
        }
        if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] == 0) {
          uVar20 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype;
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       >> 2;
              if (-1 < lVar29) {
                uVar20 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                               itype >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       >> 1;
              if (-1 < lVar29) {
                uVar20 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                               itype >> 1;
              }
            }
            else if (lVar29 < 0) {
              uVar20 = ~((int)~(uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                     m_typ.itype / iVar17);
            }
            else {
              uVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       / iVar17;
            }
          }
          uVar22 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype;
          if (iVar5 != 1) {
            if (iVar5 == 4) {
              uVar22 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       >> 2;
              if (-1 < lVar31) {
                uVar22 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                               itype >> 2;
              }
            }
            else if (iVar5 == 2) {
              uVar22 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       >> 1;
              if (-1 < lVar31) {
                uVar22 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                               itype >> 1;
              }
            }
            else if (lVar31 < 0) {
              uVar22 = ~((int)~(uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                     m_typ.itype / iVar5);
            }
            else {
              uVar22 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       / iVar5;
            }
          }
          local_2e8.super_FabArrayBase.boxarray.m_bat.m_op._0_4_ = uVar20;
          local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
               (IndexType)uVar22;
          if (iVar6 != 1) {
            if (iVar6 == 4) {
              uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] >> 2;
              if (-1 < local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0]) {
                uVar14 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                               m_crse_ratio.vect[0] >> 2;
              }
            }
            else if (iVar6 == 2) {
              uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] >> 1;
              if (-1 < local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0]) {
                uVar14 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                               m_crse_ratio.vect[0] >> 1;
              }
            }
            else if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                     [0] < 0) {
              uVar14 = ~(~local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                          vect[0] / iVar6);
            }
            else {
              uVar14 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] / iVar6;
            }
          }
        }
        else {
          local_160._0_8_ = (_List_node_base *)0x0;
          local_160._8_4_ = 0;
          lVar33 = 0;
          do {
            if ((((uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                        vect[1] >> ((uint)lVar33 & 0x1f) & 1) != 0) &&
               (*(int *)((long)&local_2e8.super_FabArrayBase.boxarray.m_bat.m_op + lVar33 * 4) %
                pIVar21->vect[lVar33] != 0)) {
              *(undefined4 *)(local_160 + lVar33 * 4) = 1;
            }
            lVar33 = lVar33 + 1;
          } while (lVar33 != 3);
          uVar20 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype;
          if (iVar17 != 1) {
            if (iVar17 == 4) {
              uVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       >> 2;
              if (-1 < lVar29) {
                uVar20 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                               itype >> 2;
              }
            }
            else if (iVar17 == 2) {
              uVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       >> 1;
              if (-1 < lVar29) {
                uVar20 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                               itype >> 1;
              }
            }
            else if (lVar29 < 0) {
              uVar20 = ~((int)~(uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                     m_typ.itype / iVar17);
            }
            else {
              uVar20 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype
                       / iVar17;
            }
          }
          uVar22 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype;
          if (iVar5 != 1) {
            if (iVar5 == 4) {
              uVar22 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       >> 2;
              if (-1 < lVar31) {
                uVar22 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                               itype >> 2;
              }
            }
            else if (iVar5 == 2) {
              uVar22 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       >> 1;
              if (-1 < lVar31) {
                uVar22 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                               itype >> 1;
              }
            }
            else if (lVar31 < 0) {
              uVar22 = ~((int)~(uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                     m_typ.itype / iVar5);
            }
            else {
              uVar22 = (int)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype
                       / iVar5;
            }
          }
          uVar18 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0];
          if (iVar6 != 1) {
            if (iVar6 == 4) {
              uVar18 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] >> 2;
              if (-1 < local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0]) {
                uVar18 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                               m_crse_ratio.vect[0] >> 2;
              }
            }
            else if (iVar6 == 2) {
              uVar18 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] >> 1;
              if (-1 < local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0]) {
                uVar18 = (uint)local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                               m_crse_ratio.vect[0] >> 1;
              }
            }
            else if (local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                     [0] < 0) {
              uVar18 = ~(~local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.
                          vect[0] / iVar6);
            }
            else {
              uVar18 = local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                       [0] / iVar6;
            }
          }
          local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
               (BATindexType)(uVar20 + local_160._0_4_);
          local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype =
               (IndexType)(uVar22 + local_160._4_4_);
          uVar14 = uVar18 + local_160._8_4_;
        }
      }
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = uVar14;
      *(ulong *)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start[lVar30].bigend.vect =
           CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype,
                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype);
      *(ulong *)(local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar30].bigend.vect + 2) =
           CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1]
                    ,local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect
                     [0]);
      *(_func_int ***)
       local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
       super__Vector_impl_data._M_start[lVar30].smallend.vect =
           local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      *(ulong *)(local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar30].smallend.vect + 2) =
           CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype,
                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      lVar30 = lVar30 + 1;
      pIVar21 = pIVar21 + 1;
    } while (iVar19 + 1 != (int)lVar30);
  }
  local_3d8 = uVar23;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_300,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&local_358,(long)(this->super_AmrInfo).max_level,(allocator_type *)&local_2e8);
  BoxList::BoxList(&local_3f8);
  BoxList::BoxList(&local_448);
  local_420 = (long)lbase;
  local_410 = local_420 * 0x68;
  __x = BoxArray::simplified_list
                  ((this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + local_420);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::vector
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)&local_320,
             (vector<amrex::Box,_std::allocator<amrex::Box>_> *)__x);
  local_320.btype.itype = (__x->btype).itype;
  BoxList::coarsen(&local_320,
                   local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_start + local_420);
  lVar29 = local_420;
  lVar30 = local_420 * 0x1b;
  BoxList::parallelComplementIn
            (&local_448,
             local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start + local_420,&local_320);
  BoxList::clear(&local_320);
  BoxList::simplify(&local_448,false);
  BoxList::accrete(&local_448,(this->super_AmrInfo).n_proper);
  pGVar7 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar31 = local_420 * 200;
  uVar23 = (ulong)(byte)pGVar7[local_420].super_CoordSys.field_0x51;
  bVar4 = pGVar7[local_420].super_CoordSys.field_0x52;
  if (((uVar23 != 0) || ((bVar4 & 1) != 0)) ||
     (pGVar7[local_420].super_CoordSys.field_0x53 == '\x01')) {
    local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)((ulong)bVar4 << 0x20 | uVar23);
    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
         (BATType)(byte)pGVar7[local_420].super_CoordSys.field_0x53;
    ProjPeriodic(&local_448,
                 local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar29,(Array<int,_3> *)&local_2e8);
  }
  BoxArray::define((BoxArray *)
                   ((long)&((local_358.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                   local_410),&local_448);
  BoxList::BoxList((BoxList *)&local_2e8);
  pBVar13 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                                itype,local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
  local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
  pBVar11 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                              m_crse_ratio.vect[0],
                              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                              itype);
  local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
       (BATindexType)(IndexType)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
  if (pBVar13 == (pointer)0x0) {
    local_448.btype.itype =
         local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
    local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pBVar11;
  }
  else {
    uVar23 = (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage - (long)pBVar13;
    local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pBVar11;
    operator_delete(pBVar13,uVar23);
    local_448.btype.itype =
         local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
    if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
      operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                      CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                               m_crse_ratio.vect[0],
                               local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                               itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
    }
  }
  BoxList::parallelComplementIn
            (&local_3f8,
             local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_start + lVar29,
             (BoxArray *)
             ((long)&((local_358.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start)->m_bat).m_bat_type + local_410));
  BoxList::simplify(&local_3f8,false);
  BoxArray::define((BoxArray *)
                   ((long)&((local_300.
                             super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                   local_410),&local_3f8);
  BoxList::BoxList((BoxList *)&local_2e8);
  pBVar13 = local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.
                                itype,local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
  local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
  pBVar11 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                              m_crse_ratio.vect[0],
                              local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                              itype);
  local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
       (BATindexType)(IndexType)0x0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
  if (pBVar13 == (pointer)0x0) {
    local_3f8.btype.itype =
         local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
    local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pBVar11;
  }
  else {
    uVar23 = (long)local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage - (long)pBVar13;
    local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pBVar11;
    operator_delete(pBVar13,uVar23);
    local_3f8.btype.itype =
         local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
    if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
      operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                      CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                               m_crse_ratio.vect[0],
                               local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                               itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
    }
  }
  iVar17 = iVar19 - lbase;
  local_3fc = lbase;
  if (iVar17 != 0 && lbase <= iVar19) {
    lVar31 = lVar31 + 0x11b;
    lVar29 = local_420 * 0xc;
    lVar30 = local_420 + lVar30;
    lVar33 = local_410;
    do {
      BoxArray::boxList((BoxList *)&local_2e8,
                        (BoxArray *)
                        ((long)&((local_358.
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                        lVar33));
      pBVar13 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                    m_typ.itype,
                                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      pBVar11 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                  m_crse_ratio.vect[0],
                                  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                  itype);
      local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           (BATindexType)(IndexType)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
      if (pBVar13 == (pointer)0x0) {
        local_448.btype.itype =
             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar11;
      }
      else {
        uVar23 = (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pBVar13;
        local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar11;
        operator_delete(pBVar13,uVar23);
        local_448.btype.itype =
             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
          operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                          CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                   m_crse_ratio.vect[0],
                                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ
                                   .itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
        }
      }
      BoxList::simplify(&local_448,false);
      BoxList::refine(&local_448,
                      (IntVect *)
                      ((long)(local_340.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar29));
      BoxList::accrete(&local_448,(this->super_AmrInfo).n_proper);
      pGVar7 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = (ulong)*(byte *)((long)(pGVar7->super_CoordSys).offset + lVar31 + 0xfffffffffffffff6U
                               );
      bVar4 = *(byte *)((long)(pGVar7->super_CoordSys).offset + lVar31 + 0xfffffffffffffff7U);
      if (((uVar23 != 0) || ((bVar4 & 1) != 0)) ||
         (*(char *)((long)(pGVar7->super_CoordSys).offset + lVar31 + -8) == '\x01')) {
        local_2e8.super_FabArrayBase._vptr_FabArrayBase =
             (_func_int **)((ulong)bVar4 << 0x20 | uVar23);
        local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type =
             (BATType)*(byte *)((long)(pGVar7->super_CoordSys).offset + lVar31 + -8);
        ProjPeriodic(&local_448,
                     (Box *)((long)local_3b8.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_start[1].smallend.vect +
                            lVar30),(Array<int,_3> *)&local_2e8);
      }
      BoxArray::define((BoxArray *)
                       ((long)&local_358.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                       lVar33),&local_448);
      BoxList::BoxList((BoxList *)&local_2e8);
      pBVar13 = local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                    m_typ.itype,
                                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      pBVar11 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                  m_crse_ratio.vect[0],
                                  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                  itype);
      local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           (BATindexType)(IndexType)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
      if (pBVar13 == (pointer)0x0) {
        local_448.btype.itype =
             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar11;
      }
      else {
        uVar23 = (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pBVar13;
        local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar11;
        operator_delete(pBVar13,uVar23);
        local_448.btype.itype =
             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
          operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                          CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                   m_crse_ratio.vect[0],
                                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ
                                   .itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
        }
      }
      BoxList::parallelComplementIn
                (&local_3f8,
                 (Box *)((long)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].smallend.vect + lVar30),
                 (BoxArray *)
                 ((long)&local_358.
                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                         _M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type + lVar33));
      BoxList::simplify(&local_3f8,false);
      BoxArray::define((BoxArray *)
                       ((long)&local_300.
                               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_bat.m_bat_type +
                       lVar33),&local_3f8);
      BoxList::BoxList((BoxList *)&local_2e8);
      pBVar13 = local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
                                    m_typ.itype,
                                    local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type);
      local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase;
      pBVar11 = (pointer)CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                  m_crse_ratio.vect[0],
                                  local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.
                                  itype);
      local_2e8.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.m_typ.itype =
           (BATindexType)(IndexType)0x0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
      local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = 0;
      if (pBVar13 == (pointer)0x0) {
        local_3f8.btype.itype =
             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar11;
      }
      else {
        uVar23 = (long)local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage - (long)pBVar13;
        local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pBVar11;
        operator_delete(pBVar13,uVar23);
        local_3f8.btype.itype =
             local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
        if ((pointer)local_2e8.super_FabArrayBase._vptr_FabArrayBase != (pointer)0x0) {
          operator_delete(local_2e8.super_FabArrayBase._vptr_FabArrayBase,
                          CONCAT44(local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
                                   m_crse_ratio.vect[0],
                                   local_2e8.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_typ
                                   .itype) - (long)local_2e8.super_FabArrayBase._vptr_FabArrayBase);
        }
      }
      lVar31 = lVar31 + 200;
      lVar29 = lVar29 + 0xc;
      iVar17 = iVar17 + -1;
      lVar30 = lVar30 + 0x1c;
      lVar33 = lVar33 + 0x68;
    } while (iVar17 != 0);
  }
  *new_finest = local_3fc;
  if (local_3fc <= iVar19) {
    local_39c = 0;
    uVar23 = (long)(int)local_3d8 - 1U;
    if ((long)iVar32 <= (long)((long)(int)local_3d8 - 1U)) {
      uVar23 = (long)iVar32;
    }
    local_3d8 = uVar23 * 0xc;
    do {
      pIVar21 = (this->super_AmrInfo).n_error_buf.
                super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_408.vect[2] = pIVar21[uVar23].vect[2];
      local_408.vect._0_8_ = *(undefined8 *)pIVar21[uVar23].vect;
      BoxArray::BoxArray(&local_98);
      lVar30 = uVar23 + 1;
      if (lVar30 < *new_finest) {
        BoxArray::simplified
                  ((BoxArray *)&local_2e8,
                   (local_418->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar23 + 2);
        BoxArray::operator=(&local_98,(BoxArray *)&local_2e8);
        BoxArray::~BoxArray((BoxArray *)&local_2e8);
        BoxArray::coarsen(&local_98,
                          (this->super_AmrInfo).ref_ratio.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar30);
        BoxArray::growcoarsen
                  (&local_98,(this->super_AmrInfo).n_proper,
                   (this->super_AmrInfo).ref_ratio.
                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar23);
        BoxArray::simplified
                  ((BoxArray *)&local_2e8,
                   (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar23);
        iVar32 = 0;
        while( true ) {
          local_160._0_8_ = (_List_node_base *)0x0;
          local_160._8_4_ = 0;
          bVar15 = BoxArray::contains((BoxArray *)&local_2e8,&local_98,false,(IntVect *)local_160);
          if (bVar15) break;
          BoxArray::grow((BoxArray *)&local_2e8,1);
          iVar32 = iVar32 + 1;
        }
        if (local_408.vect[0] <= iVar32) {
          local_408.vect[0] = iVar32;
        }
        if (local_408.vect[1] <= iVar32) {
          local_408.vect[1] = iVar32;
        }
        if (iVar32 < local_408.vect[2]) {
          iVar32 = local_408.vect[2];
        }
        local_408.vect[2] = iVar32;
        BoxArray::~BoxArray((BoxArray *)&local_2e8);
      }
      TagBoxArray::TagBoxArray
                ((TagBoxArray *)&local_2e8,
                 (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar23,
                 (this->dmap).
                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 .
                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23,&local_408);
      if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
         ((long)(this->super_AmrInfo).use_fixed_upto_level <= (long)uVar23)) {
        (*this->_vptr_AmrMesh[3])(SUB84(local_328,0),this,uVar23 & 0xffffffff,&local_2e8);
      }
      TagBoxArray::buffer((TagBoxArray *)&local_2e8,
                          (this->super_AmrInfo).n_error_buf.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar23);
      iVar32 = (int)lVar30;
      if ((this->super_AmrInfo).use_fixed_coarse_grids == true) {
        if ((long)uVar23 < (long)(this->super_AmrInfo).use_fixed_upto_level) {
          iVar19 = *new_finest;
          if (*new_finest <= iVar32) {
            iVar19 = iVar32;
          }
          *new_finest = iVar19;
        }
        else {
          (*this->_vptr_AmrMesh[6])((BoxArray *)local_160,this,uVar23 & 0xffffffff);
          TagBoxArray::setVal((TagBoxArray *)&local_2e8,(BoxArray *)local_160,CLEAR);
          BoxArray::~BoxArray((BoxArray *)local_160);
        }
      }
      lVar29 = 0;
      iVar19 = 0;
      do {
        iVar17 = *(int *)((long)(local_3d0.
                                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->vect +
                         lVar29 * 4 + local_3d8);
        if (iVar17 < iVar19) {
          iVar17 = iVar19;
        }
        iVar19 = iVar17;
        lVar29 = lVar29 + 1;
      } while (lVar29 != 3);
      if (iVar19 < 1) {
        Abort_host("blocking factor is too small relative to ref_ratio");
      }
      else {
        TagBoxArray::coarsen
                  ((TagBoxArray *)&local_2e8,
                   local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar23);
      }
      (*this->_vptr_AmrMesh[4])(this,uVar23 & 0xffffffff,&local_2e8,&local_3d0);
      if (lVar30 < *new_finest) {
        BoxArray::coarsen(&local_98,
                          local_3d0.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar23);
        TagBoxArray::setVal((TagBoxArray *)&local_2e8,&local_98,SET);
      }
      pGVar7 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start + uVar23;
      local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)(byte)(pGVar7->super_CoordSys).field_0x52 << 0x20 |
                          (ulong)(byte)(pGVar7->super_CoordSys).field_0x51);
      local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = (uint)(byte)(pGVar7->super_CoordSys).field_0x53;
      Geometry::Geometry((Geometry *)local_160,
                         local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar23,&pGVar7->prob_domain,
                         (pGVar7->super_CoordSys).c_sys,(Array<int,_3> *)&local_398);
      TagBoxArray::mapPeriodicRemoveDuplicates((TagBoxArray *)&local_2e8,(Geometry *)local_160);
      TagBoxArray::setVal((TagBoxArray *)&local_2e8,
                          local_358.
                          super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar23,CLEAR);
      BoxArray::clear(local_358.
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar23);
      local_378.m_data = (IntVect *)0x0;
      local_378.m_size = 0;
      local_378.m_capacity = 0;
      TagBoxArray::collate((TagBoxArray *)&local_2e8,&local_378);
      FabArray<amrex::TagBox>::clear(&local_2e8);
      if (local_378.m_size != 0) {
        if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
           (lVar29 = (long)(this->super_AmrInfo).use_fixed_upto_level, lVar29 <= (long)uVar23)) {
          iVar19 = *new_finest;
          if (*new_finest <= iVar32) {
            iVar19 = iVar32;
          }
          *new_finest = iVar19;
          lVar29 = (long)(this->super_AmrInfo).use_fixed_upto_level;
        }
        if (lVar29 <= (long)uVar23) {
          BoxList::BoxList(&local_398);
          if (*(int *)(ParallelContext::frames + 0xc) == local_39c) {
            ClusterList::ClusterList((ClusterList *)local_160,local_378.m_data,local_378.m_size);
            eff = (this->super_AmrInfo).grid_eff;
            if ((this->super_AmrInfo).use_new_chop == true) {
              ClusterList::new_chop((ClusterList *)local_160,eff);
            }
            else {
              ClusterList::chop((ClusterList *)local_160,eff);
            }
            ClusterList::intersect
                      ((ClusterList *)local_160,
                       local_300.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + uVar23);
            ClusterList::boxList((ClusterList *)local_160,&local_398);
            BoxList::refine(&local_398,
                            local_3d0.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start + uVar23);
            BoxList::simplify(&local_398,false);
            if ((pointer)CONCAT44(local_398.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (uint)local_398.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_finish) !=
                local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start &&
                -1 < (long)CONCAT44(local_398.m_lbox.
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (uint)local_398.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_finish) -
                     (long)local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start) {
              BoxList::intersect(&local_398,
                                 &(this->geom).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar23].domain);
            }
            ClusterList::~ClusterList((ClusterList *)local_160);
          }
          BoxList::Bcast(&local_398);
          BoxList::refine(&local_398,
                          (this->super_AmrInfo).ref_ratio.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar23);
          BoxArray::BoxArray((BoxArray *)local_160,&local_398,
                             (this->super_AmrInfo).max_grid_size.
                             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar30);
          BoxArray::operator=((local_418->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar30,
                              (BoxArray *)local_160);
          BoxArray::~BoxArray((BoxArray *)local_160);
          if (local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_398.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_398.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_398.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      if (local_378.m_data != (IntVect *)0x0) {
        operator_delete(local_378.m_data,local_378.m_capacity * 0xc);
      }
      FabArray<amrex::TagBox>::~FabArray(&local_2e8);
      BoxArray::~BoxArray(&local_98);
      local_3d8 = local_3d8 - 0xc;
      bVar15 = local_420 < (long)uVar23;
      uVar23 = uVar23 - 1;
    } while (bVar15);
    if (local_3fc < *new_finest) {
      lVar29 = local_410 + 200;
      lVar30 = local_420;
      iVar32 = local_3fc;
      do {
        iVar32 = iVar32 + 1;
        lVar30 = lVar30 + 1;
        pBVar8 = (local_418->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                 super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                 super__Vector_impl_data._M_start;
        plVar9 = *(long **)((long)pBVar8 + lVar29 + -0x18);
        if (*plVar9 == plVar9[1]) {
          if (((this->super_AmrInfo).use_fixed_coarse_grids != true) ||
             ((this->super_AmrInfo).use_fixed_upto_level <= lVar30)) {
            Abort_host("AmrMesh::MakeNewGrids: how did this happen?");
          }
        }
        else if ((this->super_AmrInfo).refine_grid_layout == true) {
          ChopGrids(this,iVar32,(BoxArray *)((long)pBVar8 + lVar29 + -0x60),
                    *(int *)(ParallelContext::frames + 0x10));
          bVar15 = BoxArray::operator==
                             ((BoxArray *)
                              ((long)(local_418->
                                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     ).
                                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x60),
                              (BoxArray *)
                              ((long)(this->grids).
                                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     .
                                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x60));
          if (bVar15) {
            pBVar8 = (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pBVar10 = (local_418->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar1 = (undefined8 *)((long)pBVar10 + lVar29 + -0x60);
            puVar24 = (undefined8 *)((long)pBVar8 + lVar29 + -0x60);
            puVar26 = puVar1;
            for (lVar31 = 9; lVar31 != 0; lVar31 = lVar31 + -1) {
              *puVar26 = *puVar24;
              puVar24 = puVar24 + (ulong)bVar34 * -2 + 1;
              puVar26 = puVar26 + (ulong)bVar34 * -2 + 1;
            }
            puVar1[9] = *(undefined8 *)((long)pBVar8 + lVar29 + -0x18);
            this_00 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)pBVar10 + lVar29 + -0x10)
            ;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (this_00,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)pBVar8 + lVar29 + -0x10));
            this_00[1]._M_pi =
                 *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pBVar8 + lVar29 + -8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(pBVar10->m_bat).m_bat_type + lVar29),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)&(pBVar8->m_bat).m_bat_type + lVar29));
          }
        }
        lVar29 = lVar29 + 0x68;
      } while (lVar30 < *new_finest);
    }
  }
  if (local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_320.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_448.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f8.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_358);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector(&local_300);
  if (local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3b8.super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_340.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_340.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_340.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d0.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d0.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
AmrMesh::MakeNewGrids (int lbase, Real time, int& new_finest, Vector<BoxArray>& new_grids)
{
    BL_PROFILE("AmrMesh::MakeNewGrids()");

    BL_ASSERT(lbase < max_level);

    // Add at most one new level
    int max_crse = std::min(finest_level, max_level-1);

    if (new_grids.size() < max_crse+2) new_grids.resize(max_crse+2);

    //
    // Construct problem domain at each level.
    //
    Vector<IntVect> bf_lev(max_level); // Blocking factor at each level.
    Vector<IntVect> rr_lev(max_level);
    Vector<Box>     pc_domain(max_level);  // Coarsened problem domain.

    for (int i = 0; i <= max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bf_lev[i][n] = std::max(1,blocking_factor[i+1][n]/ref_ratio[i][n]);
        }
    }
    for (int i = lbase; i < max_crse; i++)
    {
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            // Note that in AmrMesh we check that
            // ref ratio * coarse blocking factor >= fine blocking factor
            rr_lev[i][n] = (ref_ratio[i][n]*bf_lev[i][n])/bf_lev[i+1][n];
        }
    }
    for (int i = lbase; i <= max_crse; i++) {
        pc_domain[i] = amrex::coarsen(Geom(i).Domain(),bf_lev[i]);
    }
    //
    // Construct proper nesting domains.
    //
    Vector<BoxArray> p_n_ba(max_level); // Proper nesting domain.
    Vector<BoxArray> p_n_comp_ba(max_level); // Complement proper nesting domain.
    BoxList p_n, p_n_comp;

    BoxList bl = grids[lbase].simplified_list();
    bl.coarsen(bf_lev[lbase]);
    p_n_comp.parallelComplementIn(pc_domain[lbase],bl);
    bl.clear();
    p_n_comp.simplify();
    p_n_comp.accrete(n_proper);
    if (geom[lbase].isAnyPeriodic()) {
        ProjPeriodic(p_n_comp, pc_domain[lbase], geom[lbase].isPeriodic());
    }

    p_n_comp_ba[lbase].define(std::move(p_n_comp));
    p_n_comp = BoxList();

    p_n.parallelComplementIn(pc_domain[lbase],p_n_comp_ba[lbase]);
    p_n.simplify();

    p_n_ba[lbase].define(std::move(p_n));
    p_n = BoxList();

    for (int i = lbase+1; i <= max_crse; i++)
    {
        p_n_comp = p_n_comp_ba[i-1].boxList();

        // Need to simplify p_n_comp or the number of grids can too large for many levels.
        p_n_comp.simplify();

        p_n_comp.refine(rr_lev[i-1]);
        p_n_comp.accrete(n_proper);

        if (geom[i].isAnyPeriodic()) {
            ProjPeriodic(p_n_comp, pc_domain[i], geom[i].isPeriodic());
        }

        p_n_comp_ba[i].define(std::move(p_n_comp));
        p_n_comp = BoxList();

        p_n.parallelComplementIn(pc_domain[i],p_n_comp_ba[i]);
        p_n.simplify();

        p_n_ba[i].define(std::move(p_n));
        p_n = BoxList();
    }

    //
    // Now generate grids from finest level down.
    //
    new_finest = lbase;

    for (int levc = max_crse; levc >= lbase; levc--)
    {
        int levf = levc+1;
        //
        // Construct TagBoxArray with sufficient grow factor to contain
        // new levels projected down to this level.
        //
        IntVect ngt = n_error_buf[levc];
        BoxArray ba_proj;
        if (levf < new_finest)
        {
            ba_proj = new_grids[levf+1].simplified();
            ba_proj.coarsen(ref_ratio[levf]);
            ba_proj.growcoarsen(n_proper, ref_ratio[levc]);

            BoxArray levcBA = grids[levc].simplified();
            int ngrow = 0;
            while (!levcBA.contains(ba_proj))
            {
                levcBA.grow(1);
                ++ngrow;
            }
            ngt.max(IntVect(ngrow));
        }
        TagBoxArray tags(grids[levc],dmap[levc],ngt);

        //
        // Only use error estimation to tag cells for the creation of new grids
        //      if the grids at that level aren't already fixed.
        //

        if ( ! (useFixedCoarseGrids() && levc < useFixedUpToLevel()) ) {
            ErrorEst(levc, tags, time, 0);
        }

        //
        // Buffer error cells.
        //
        tags.buffer(n_error_buf[levc]);

        if (useFixedCoarseGrids())
        {
            if (levc>=useFixedUpToLevel())
            {
                tags.setVal(GetAreaNotToTag(levc), TagBox::CLEAR);
            }
            else
            {
                new_finest = std::max(new_finest,levf);
            }
        }

        //
        // Coarsen the taglist by blocking_factor/ref_ratio.
        //
        int bl_max = 0;
        for (int n=0; n<AMREX_SPACEDIM; n++) {
            bl_max = std::max(bl_max,bf_lev[levc][n]);
        }
        if (bl_max >= 1) {
            tags.coarsen(bf_lev[levc]);
        } else {
            amrex::Abort("blocking factor is too small relative to ref_ratio");
        }
        //
        // Remove or add tagged points which violate/satisfy additional
        // user-specified criteria.
        //
        ManualTagsPlacement(levc, tags, bf_lev);
        //
        // If new grids have been constructed above this level, project
        // those grids down and tag cells on intersections to ensure
        // proper nesting.
        //
        if (levf < new_finest) {
            ba_proj.coarsen(bf_lev[levc]);
            tags.setVal(ba_proj,TagBox::SET);
        }
        //
        // Map tagged points through periodic boundaries, if any.
        //
        tags.mapPeriodicRemoveDuplicates(Geometry(pc_domain[levc],
                                                  Geom(levc).ProbDomain(),
                                                  Geom(levc).CoordInt(),
                                                  Geom(levc).isPeriodic()));
        //
        // Remove cells outside proper nesting domain for this level.
        //
        tags.setVal(p_n_comp_ba[levc],TagBox::CLEAR);
        p_n_comp_ba[levc].clear();
        //
        // Create initial cluster containing all tagged points.
        //
        Gpu::PinnedVector<IntVect> tagvec;
        tags.collate(tagvec);
        tags.clear();

        if (tagvec.size() > 0)
        {
            //
            // Created new level, now generate efficient grids.
            //
            if ( !(useFixedCoarseGrids() && levc<useFixedUpToLevel()) ) {
                new_finest = std::max(new_finest,levf);
            }

            if (levf > useFixedUpToLevel()) {
                BoxList new_bx;
                if (ParallelDescriptor::IOProcessor()) {
                    BL_PROFILE("AmrMesh-cluster");
                    //
                    // Construct initial cluster.
                    //
                    ClusterList clist(&tagvec[0], tagvec.size());
                    if (use_new_chop) {
                        clist.new_chop(grid_eff);
                    } else {
                        clist.chop(grid_eff);
                    }
                    clist.intersect(p_n_ba[levc]);
                    //
                    // Efficient properly nested Clusters have been constructed
                    // now generate list of grids at level levf.
                    //
                    clist.boxList(new_bx);
                    new_bx.refine(bf_lev[levc]);
                    new_bx.simplify();

                    if (new_bx.size()>0) {
                        // Chop new grids outside domain
                        new_bx.intersect(Geom(levc).Domain());
                    }
                }
                new_bx.Bcast();  // Broadcast the new BoxList to other processes

                //
                // Refine up to levf.
                //
                new_bx.refine(ref_ratio[levc]);
                BL_ASSERT(new_bx.isDisjoint());

                new_grids[levf] = BoxArray(std::move(new_bx), max_grid_size[levf]);
            }
        }
    }

#if 0
    if (!useFixedCoarseGrids()) {
        // check proper nesting
        // This check does not consider periodic boundary and could fail if
        // the blocking factor is not the same on all levels.
        for (int lev = lbase+1; lev <= new_finest; ++lev) {
            BoxArray const& cba = (lev == lbase+1) ? grids[lev-1] : new_grids[lev-1];
            BoxArray const& fba = amrex::coarsen(new_grids[lev],ref_ratio[lev-1]);
            IntVect np = bf_lev[lev-1] * n_proper;
            Box const& cdomain = Geom(lev-1).Domain();
            for (int i = 0, N = fba.size(); i < N; ++i) {
                Box const& fb = amrex::grow(fba[i],np) & cdomain;
                if (!cba.contains(fb,true)) {
                    amrex::Abort("AmrMesh::MakeNewGrids: new grids not properly nested");
                }
            }
        }
    }
#endif

    for (int lev = lbase+1; lev <= new_finest; ++lev) {
        if (new_grids[lev].empty())
        {
            if (!(useFixedCoarseGrids() && lev<useFixedUpToLevel()) ) {
                amrex::Abort("AmrMesh::MakeNewGrids: how did this happen?");
            }
        }
        else if (refine_grid_layout)
        {
            ChopGrids(lev,new_grids[lev],ParallelDescriptor::NProcs());
            if (new_grids[lev] == grids[lev]) {
                new_grids[lev] = grids[lev]; // to avoid duplicates
            }
        }
    }
}